

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
::load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul>
          (argument_loader<std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
           *this,initializer_list<bool> *call)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_00;
  reference pvVar2;
  __tuple_element_t<1UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_01;
  __tuple_element_t<2UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_02;
  __tuple_element_t<3UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_03;
  __tuple_element_t<4UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_04;
  __tuple_element_t<5UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_05;
  __tuple_element_t<6UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_06;
  __tuple_element_t<7UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_07;
  __tuple_element_t<8UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_08;
  __tuple_element_t<9UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_09;
  __tuple_element_t<10UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_10;
  __tuple_element_t<11UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_11;
  __tuple_element_t<12UL,_tuple<type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<map<basic_string<char>,_basic_string<char>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_basic_string<char>_>_>_>,_void>,_type_caster<set<basic_string<char>,_less<basic_string<char>_>,_allocator<basic_string<char>_>_>,_void>,_type_caster<map<basic_string<char>,_bool,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_bool>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *this_12;
  const_iterator pbVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  handle local_170;
  reference local_168;
  handle local_158;
  reference local_150;
  handle local_140;
  reference local_138;
  handle local_128;
  reference local_120;
  handle local_110;
  reference local_108;
  handle local_f8;
  reference local_f0;
  handle local_e0;
  reference local_d8;
  handle local_c8;
  reference local_c0;
  handle local_b0;
  reference local_a8;
  handle local_98;
  reference local_90;
  handle local_80;
  reference local_78;
  handle local_68;
  reference local_60;
  handle local_50;
  bool local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  initializer_list<bool> local_38;
  initializer_list<bool> *local_28;
  initializer_list<bool> *__range3;
  function_call *call_local;
  argument_loader<_f92f1db6_> *this_local;
  
  __range3 = call;
  call_local = (function_call *)this;
  this_00 = std::
            get<0ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,0);
  local_50.m_ptr = pvVar2->m_ptr;
  local_60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),0);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_60);
  local_45 = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::load(this_00,local_50,bVar1);
  this_01 = std::
            get<1ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,1);
  local_68.m_ptr = pvVar2->m_ptr;
  local_78 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),1);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_78);
  local_44 = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::load(this_01,local_68,bVar1);
  this_02 = std::
            get<2ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,2);
  local_80.m_ptr = pvVar2->m_ptr;
  local_90 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),2);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_90);
  local_43 = map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::load(&this_02->
                     super_map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,local_80,bVar1);
  this_03 = std::
            get<3ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,3);
  local_98.m_ptr = pvVar2->m_ptr;
  local_a8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),3);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_a8);
  local_42 = set_caster<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::load(&this_03->
                     super_set_caster<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,local_98,bVar1);
  this_04 = std::
            get<4ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,4);
  local_b0.m_ptr = pvVar2->m_ptr;
  local_c0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),4);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_c0);
  local_41 = map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             ::load(&this_04->
                     super_map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                    ,local_b0,bVar1);
  this_05 = std::
            get<5ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,5);
  local_c8.m_ptr = pvVar2->m_ptr;
  local_d8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),5);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_d8);
  local_40 = map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
             ::load(&this_05->
                     super_map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                    ,local_c8,bVar1);
  this_06 = std::
            get<6ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,6);
  local_e0.m_ptr = pvVar2->m_ptr;
  local_f0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),6);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_f0);
  local_3f = map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
             ::load(&this_06->
                     super_map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                    ,local_e0,bVar1);
  this_07 = std::
            get<7ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,7);
  local_f8.m_ptr = pvVar2->m_ptr;
  local_108 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),7);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_108);
  local_3e = map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
             ::load(&this_07->
                     super_map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                    ,local_f8,bVar1);
  this_08 = std::
            get<8ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,8);
  local_110.m_ptr = pvVar2->m_ptr;
  local_120 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),8);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_120);
  local_3d = map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
             ::load(&this_08->
                     super_map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                    ,local_110,bVar1);
  this_09 = std::
            get<9ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,9);
  local_128.m_ptr = pvVar2->m_ptr;
  local_138 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),9);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_138);
  local_3c = map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
             ::load(&this_09->
                     super_map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                    ,local_128,bVar1);
  this_10 = std::
            get<10ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,10);
  local_140.m_ptr = pvVar2->m_ptr;
  local_150 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),10);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_150);
  local_3b = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::load(this_10,local_140,bVar1);
  this_11 = std::
            get<11ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,0xb);
  local_158.m_ptr = pvVar2->m_ptr;
  local_168 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),0xb);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_168);
  local_3a = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::load(this_11,local_158,bVar1);
  this_12 = std::
            get<12ul,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,void>,pybind11::detail::type_caster<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<_e2064933_> *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,0xc);
  local_170.m_ptr = pvVar2->m_ptr;
  ___begin0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),0xc);
  bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__begin0);
  local_39 = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::load(this_12,local_170,bVar1);
  local_38._M_array = &local_45;
  local_38._M_len = 0xd;
  local_28 = &local_38;
  __end0 = std::initializer_list<bool>::begin(local_28);
  pbVar3 = std::initializer_list<bool>::end(local_28);
  while( true ) {
    if (__end0 == pbVar3) {
      return true;
    }
    if ((*__end0 & 1U) == 0) break;
    __end0 = __end0 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(value).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }